

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O1

string * duckdb::ToJsonMapInternal
                   (string *__return_storage_ptr__,
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *map,yyjson_mut_doc *doc,yyjson_mut_val *root)

{
  yyjson_val_pool *pool;
  yyjson_alc *alc;
  yyjson_str_pool *pool_00;
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  ulong uVar3;
  long lVar4;
  yyjson_mut_val *pyVar5;
  yyjson_mut_val *pyVar6;
  char *pcVar7;
  yyjson_mut_val *pyVar8;
  _Hash_node_base *p_Var9;
  bool bVar10;
  
  p_Var9 = (map->_M_h)._M_before_begin._M_nxt;
  if (p_Var9 != (_Hash_node_base *)0x0) {
    pool = &doc->val_pool;
    alc = &doc->alc;
    pool_00 = &doc->str_pool;
    do {
      if (doc == (yyjson_mut_doc *)0x0) {
LAB_01418e6a:
        pyVar8 = (yyjson_mut_val *)0x0;
      }
      else {
        p_Var1 = p_Var9[1]._M_nxt;
        pyVar8 = (yyjson_mut_val *)0x0;
        if (p_Var1 != (_Hash_node_base *)0x0) {
          p_Var2 = p_Var9[2]._M_nxt;
          if (((doc->val_pool).end != (doc->val_pool).cur) ||
             (bVar10 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pool,alc,1), bVar10)) {
            pyVar5 = pool->cur;
            pool->cur = pyVar5 + 1;
          }
          else {
            pyVar5 = (yyjson_mut_val *)0x0;
          }
          if ((p_Var2 < (_Hash_node_base *)((doc->str_pool).end + -(long)(doc->str_pool).cur)) ||
             (bVar10 = duckdb_yyjson::unsafe_yyjson_str_pool_grow
                                 (pool_00,alc,(usize)((long)&p_Var2->_M_nxt + 1)), bVar10)) {
            pcVar7 = pool_00->cur;
            pool_00->cur = pcVar7 + (long)p_Var2 + 1;
          }
          else {
            pcVar7 = (char *)0x0;
          }
          if (pcVar7 == (char *)0x0) {
            pcVar7 = (char *)0x0;
          }
          else {
            switchD_012dd528::default(pcVar7,p_Var1,(size_t)p_Var2);
            pcVar7[(long)p_Var2] = '\0';
          }
          if (pyVar5 == (yyjson_mut_val *)0x0) goto LAB_01418e6a;
          pyVar8 = (yyjson_mut_val *)0x0;
          if (pcVar7 != (char *)0x0) {
            pyVar5->tag = (long)p_Var2 << 8 | 5;
            (pyVar5->uni).ptr = pcVar7;
            pyVar8 = pyVar5;
          }
        }
      }
      if (doc == (yyjson_mut_doc *)0x0) {
LAB_01418e72:
        pyVar5 = (yyjson_mut_val *)0x0;
      }
      else {
        p_Var1 = p_Var9[5]._M_nxt;
        pyVar5 = (yyjson_mut_val *)0x0;
        if (p_Var1 != (_Hash_node_base *)0x0) {
          p_Var2 = p_Var9[6]._M_nxt;
          if (((doc->val_pool).end != (doc->val_pool).cur) ||
             (bVar10 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pool,alc,1), bVar10)) {
            pyVar6 = pool->cur;
            pool->cur = pyVar6 + 1;
          }
          else {
            pyVar6 = (yyjson_mut_val *)0x0;
          }
          if ((p_Var2 < (_Hash_node_base *)((doc->str_pool).end + -(long)(doc->str_pool).cur)) ||
             (bVar10 = duckdb_yyjson::unsafe_yyjson_str_pool_grow
                                 (pool_00,alc,(usize)((long)&p_Var2->_M_nxt + 1)), bVar10)) {
            pcVar7 = pool_00->cur;
            pool_00->cur = pcVar7 + (long)p_Var2 + 1;
          }
          else {
            pcVar7 = (char *)0x0;
          }
          if (pcVar7 == (char *)0x0) {
            pcVar7 = (char *)0x0;
          }
          else {
            switchD_012dd528::default(pcVar7,p_Var1,(size_t)p_Var2);
            pcVar7[(long)p_Var2] = '\0';
          }
          if (pyVar6 == (yyjson_mut_val *)0x0) goto LAB_01418e72;
          pyVar5 = (yyjson_mut_val *)0x0;
          if (pcVar7 != (char *)0x0) {
            pyVar6->tag = (long)p_Var2 << 8 | 5;
            (pyVar6->uni).ptr = pcVar7;
            pyVar5 = pyVar6;
          }
        }
      }
      if ((root != (yyjson_mut_val *)0x0) && ((~(uint)root->tag & 7) == 0)) {
        if (pyVar8 == (yyjson_mut_val *)0x0) {
          bVar10 = false;
        }
        else {
          bVar10 = (pyVar8->tag & 7) == 5;
        }
        if ((bVar10) && (pyVar5 != (yyjson_mut_val *)0x0)) {
          uVar3 = root->tag;
          pyVar6 = pyVar8;
          if (0xff < uVar3) {
            lVar4 = *(long *)((root->uni).u64 + 0x10);
            pyVar6 = *(yyjson_mut_val **)(lVar4 + 0x10);
            *(yyjson_mut_val **)(lVar4 + 0x10) = pyVar8;
          }
          pyVar5->next = pyVar6;
          pyVar8->next = pyVar5;
          (root->uni).str = (char *)pyVar8;
          root->tag = (uVar3 & 0xff) + (uVar3 & 0xffffffffffffff00) + 0x100;
        }
      }
      p_Var9 = p_Var9->_M_nxt;
    } while (p_Var9 != (_Hash_node_base *)0x0);
  }
  WriteJsonToString_abi_cxx11_(__return_storage_ptr__,(duckdb *)doc,doc);
  return __return_storage_ptr__;
}

Assistant:

string ToJsonMapInternal(const unordered_map<string, string> &map, yyjson_mut_doc *doc, yyjson_mut_val *root) {
	for (auto &entry : map) {
		auto key = yyjson_mut_strncpy(doc, entry.first.c_str(), entry.first.size());
		auto value = yyjson_mut_strncpy(doc, entry.second.c_str(), entry.second.size());
		yyjson_mut_obj_add(root, key, value);
	}
	return WriteJsonToString(doc);
}